

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

void __thiscall CppJieba::TrieNodeInfo::TrieNodeInfo(TrieNodeInfo *this,TrieNodeInfo *nodeInfo)

{
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->word,&nodeInfo->word);
  this->freq = nodeInfo->freq;
  std::__cxx11::string::string((string *)&this->tag,(string *)&nodeInfo->tag);
  this->logFreq = nodeInfo->logFreq;
  return;
}

Assistant:

TrieNodeInfo(const TrieNodeInfo& nodeInfo):word(nodeInfo.word), freq(nodeInfo.freq), tag(nodeInfo.tag), logFreq(nodeInfo.logFreq)
        {
        }